

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

bool __thiscall QDockAreaLayoutInfo::onlyHasPlaceholders(QDockAreaLayoutInfo *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  
  lVar1 = (this->item_list).d.size;
  if (lVar1 == 0) {
    return true;
  }
  lVar3 = 0;
  do {
    bVar4 = *(long *)((long)&((this->item_list).d.ptr)->placeHolderItem + lVar3) == 0;
    bVar2 = !bVar4;
    if (bVar4) {
      return bVar2;
    }
    bVar4 = lVar1 * 0x28 + -0x28 != lVar3;
    lVar3 = lVar3 + 0x28;
  } while (bVar4);
  return bVar2;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }